

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

void __thiscall wallet::RecordHeader::Unserialize<AutoFile>(RecordHeader *this,AutoFile *s)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  uint16_t obj;
  uint8_t obj_1;
  uint16_t local_24;
  RecordType local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x2,in_RCX);
  this->len = local_24;
  AutoFile::read(s,(int)&local_21,(void *)0x1,in_RCX);
  this->type = local_21 & ~DELETE;
  this->deleted = (bool)(local_21 >> 7);
  if (this->other_endian == true) {
    this->len = this->len << 8 | this->len >> 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> len;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<RecordType>(uint8_type & ~static_cast<uint8_t>(RecordType::DELETE));
        deleted = uint8_type & static_cast<uint8_t>(RecordType::DELETE);

        if (other_endian) {
            len = internal_bswap_16(len);
        }
    }